

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

root_type ising::free_energy::
          specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                    (fvar<double,_2UL> f,fvar<double,_2UL> beta)

{
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar1;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar2;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar3;
  
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>(&f,0);
  gVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    (&f,1);
  gVar2 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    (&f,2);
  gVar3 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    (&beta,0);
  return gVar3 * -gVar3 * (gVar1 + gVar1 + gVar2 * gVar3);
}

Assistant:

inline typename U::root_type specific_heat(U f, U beta) {
  auto f0 = f.derivative(0);
  auto f1 = f.derivative(1);
  auto f2 = f.derivative(2);
  auto b0 = beta.derivative(0);
  return -(b0 * b0 * (2 * f1 + b0 * f2));
}